

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

void __thiscall
duckdb_mbedtls::MbedTlsWrapper::SHA256State::AddString(SHA256State *this,string *str)

{
  int iVar1;
  runtime_error *this_00;
  
  iVar1 = mbedtls_sha256_update
                    ((mbedtls_sha256_context *)this->sha_context,(uchar *)(str->_M_dataplus)._M_p,
                     str->_M_string_length);
  if (iVar1 == 0) {
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"SHA256 Error");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MbedTlsWrapper::SHA256State::AddString(const std::string &str) {
	auto context = reinterpret_cast<mbedtls_sha256_context *>(sha_context);
	if (mbedtls_sha256_update(context, (unsigned char *)str.data(), str.size())) {
		throw std::runtime_error("SHA256 Error");
	}
}